

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

bool rsg::anon_unknown_0::canAllocateVariable(GeneratorState *state,VariableType *type)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  VariableManager *this;
  ShaderParameters *pSVar4;
  VariableType *type_local;
  GeneratorState *state_local;
  
  dVar1 = GeneratorState::getExpressionFlags(state);
  if ((dVar1 & 2) == 0) {
    this = GeneratorState::getVariableManager(state);
    iVar2 = VariableManager::getNumAllocatedScalars(this);
    iVar3 = VariableType::getScalarSize(type);
    pSVar4 = GeneratorState::getShaderParameters(state);
    if (pSVar4->maxCombinedVariableScalars < iVar2 + iVar3) {
      state_local._7_1_ = false;
    }
    else {
      state_local._7_1_ = true;
    }
  }
  else {
    state_local._7_1_ = false;
  }
  return state_local._7_1_;
}

Assistant:

bool canAllocateVariable (const GeneratorState& state, const VariableType& type)
{
	DE_ASSERT(!type.isVoid());

	if (state.getExpressionFlags() & NO_VAR_ALLOCATION)
		return false;

	if (state.getVariableManager().getNumAllocatedScalars() + type.getScalarSize() > state.getShaderParameters().maxCombinedVariableScalars)
		return false;

	return true;
}